

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O0

void __thiscall
duckdb::AlpRDScanState<double>::Skip
          (AlpRDScanState<double> *this,ColumnSegment *col_segment,idx_t skip_count)

{
  bool bVar1;
  idx_t b;
  unsigned_long uVar2;
  AlpRDScanState<double> *in_RDX;
  AlpRDScanState<double> *in_RDI;
  idx_t i;
  idx_t vectors_to_skip;
  idx_t to_skip;
  AlpRDScanState<double> *in_stack_ffffffffffffffc0;
  AlpRDScanState<double> *in_stack_ffffffffffffffd0;
  AlpRDScanState<double> *this_00;
  AlpRDScanState<double> *local_18;
  
  local_18 = in_RDX;
  if ((in_RDI->total_value_count != 0) && (bVar1 = VectorFinished(in_RDI), !bVar1)) {
    in_stack_ffffffffffffffc0 = in_RDX;
    b = LeftInVector(in_RDI);
    uVar2 = MinValue<unsigned_long>((unsigned_long)in_stack_ffffffffffffffc0,b);
    ScanVector<unsigned_long,true>
              (in_stack_ffffffffffffffd0,(unsigned_long *)in_RDI,(idx_t)in_stack_ffffffffffffffc0);
    local_18 = (AlpRDScanState<double> *)((long)in_RDX - uVar2);
  }
  for (this_00 = (AlpRDScanState<double> *)0x0;
      this_00 < (AlpRDScanState<double> *)((ulong)local_18 >> 10);
      this_00 = (AlpRDScanState<double> *)
                ((long)&(this_00->super_SegmentScanState)._vptr_SegmentScanState + 1)) {
    SkipVector(in_stack_ffffffffffffffc0);
  }
  if ((long)local_18 + (long)((ulong)local_18 >> 10) * -0x400 != 0) {
    ScanVector<unsigned_long,true>(this_00,(unsigned_long *)in_RDI,(idx_t)in_stack_ffffffffffffffc0)
    ;
  }
  return;
}

Assistant:

void Skip(ColumnSegment &col_segment, idx_t skip_count) {
		if (total_value_count != 0 && !VectorFinished()) {
			// Finish skipping the current vector
			idx_t to_skip = MinValue<idx_t>(skip_count, LeftInVector());
			ScanVector<EXACT_TYPE, true>(nullptr, to_skip);
			skip_count -= to_skip;
		}
		// Figure out how many entire vectors we can skip
		// For these vectors, we don't even need to process the metadata or values
		idx_t vectors_to_skip = skip_count / AlpRDConstants::ALP_VECTOR_SIZE;
		for (idx_t i = 0; i < vectors_to_skip; i++) {
			SkipVector();
		}
		skip_count -= AlpRDConstants::ALP_VECTOR_SIZE * vectors_to_skip;
		if (skip_count == 0) {
			return;
		}
		// For the last vector that this skip (partially) touches, we do need to
		// load the metadata and values into the vector_state because
		// we don't know exactly how many they are
		ScanVector<EXACT_TYPE, true>(nullptr, skip_count);
	}